

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O1

void Vec_QueUpdate(Vec_Que_t *p,int v)

{
  float *pfVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pfVar1 = *p->pCostsFlt;
  if (pfVar1 == (float *)0x0) {
    fVar13 = (float)v;
  }
  else {
    fVar13 = pfVar1[v];
  }
  piVar2 = p->pOrder;
  uVar8 = piVar2[v];
  uVar10 = (ulong)(int)uVar8;
  if (uVar10 == 0xffffffffffffffff) {
    __assert_fail("p->pOrder[v] != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  piVar3 = p->pHeap;
  if (piVar3[uVar10] != v) {
    __assert_fail("p->pHeap[i] == v",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                  ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
  }
  bVar4 = true;
  if (1 < (int)uVar8) {
    uVar11 = uVar10;
    uVar10 = (ulong)uVar8;
    bVar5 = false;
    do {
      bVar4 = bVar5;
      uVar10 = uVar10 >> 1;
      iVar9 = piVar3[uVar10];
      if (pfVar1 == (float *)0x0) {
        fVar14 = (float)iVar9;
      }
      else {
        fVar14 = pfVar1[iVar9];
      }
      uVar8 = (uint)uVar11;
      if (fVar13 <= fVar14) {
        uVar10 = uVar11 & 0xffffffff;
        break;
      }
      piVar3[uVar11 & 0xffffffff] = iVar9;
      piVar2[iVar9] = uVar8;
      bVar4 = true;
      uVar11 = uVar10;
      bVar5 = true;
    } while (3 < uVar8);
    bVar4 = !bVar4;
  }
  iVar9 = (int)uVar10;
  piVar3[iVar9] = v;
  piVar2[v] = iVar9;
  if (bVar4) {
    if (pfVar1 == (float *)0x0) {
      fVar13 = (float)v;
    }
    else {
      fVar13 = pfVar1[v];
    }
    uVar8 = iVar9 * 2;
    iVar12 = p->nSize;
    if ((int)uVar8 < iVar12) {
      do {
        iVar9 = (int)uVar10;
        uVar7 = uVar8 | 1;
        if ((int)uVar7 < iVar12) {
          if (pfVar1 == (float *)0x0) {
            fVar14 = (float)piVar3[(int)uVar8];
          }
          else {
            fVar14 = pfVar1[piVar3[(int)uVar8]];
          }
          if (pfVar1 == (float *)0x0) {
            fVar15 = (float)piVar3[(int)uVar7];
          }
          else {
            fVar15 = pfVar1[piVar3[(int)uVar7]];
          }
          uVar10 = (ulong)uVar8;
          if (fVar14 < fVar15) {
            uVar10 = (ulong)uVar7;
          }
        }
        else {
          uVar10 = (ulong)uVar8;
        }
        iVar6 = (int)uVar10;
        if (iVar12 <= iVar6) {
          __assert_fail("child < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                        ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
        }
        iVar12 = piVar3[iVar6];
        if (pfVar1 == (float *)0x0) {
          fVar14 = (float)iVar12;
        }
        else {
          fVar14 = pfVar1[iVar12];
        }
        if (fVar14 <= fVar13) break;
        piVar3[iVar9] = iVar12;
        piVar2[iVar12] = iVar9;
        uVar8 = iVar6 * 2;
        iVar12 = p->nSize;
        iVar9 = iVar6;
      } while ((int)uVar8 < iVar12);
    }
    piVar3[iVar9] = v;
    piVar2[v] = iVar9;
  }
  return;
}

Assistant:

static inline float Vec_QuePrio( Vec_Que_t * p, int v ) { return *p->pCostsFlt ? (*p->pCostsFlt)[v] : v; }